

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.cpp
# Opt level: O1

void rc::detail::showValue(string *value,ostream *os)

{
  byte bVar1;
  undefined4 uVar2;
  size_type sVar3;
  locale *plVar4;
  ctype *pcVar5;
  long lVar6;
  size_type sVar7;
  char *pcVar8;
  ulong uVar9;
  byte local_3c [4];
  pointer local_38;
  
  plVar4 = (locale *)std::locale::classic();
  local_3c[2] = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(local_3c + 2),1);
  sVar3 = value->_M_string_length;
  if (sVar3 != 0) {
    local_38 = (value->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      bVar1 = local_38[sVar7];
      uVar9 = (ulong)bVar1;
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      if (((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + uVar9 * 2) & 0x20) == 0) &&
         (pcVar5 = std::use_facet<std::ctype<char>>(plVar4),
         (*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + uVar9 * 2) & 0x40) != 0)) {
        if (bVar1 == 0x22) {
          lVar6 = 2;
          pcVar8 = "\\\"";
        }
        else if (bVar1 == 0x5c) {
          lVar6 = 1;
          pcVar8 = "\\";
        }
        else {
          lVar6 = 1;
          pcVar8 = (char *)local_3c;
          local_3c[0] = bVar1;
        }
        goto LAB_00169ec6;
      }
      switch(uVar9) {
      case 0:
        lVar6 = 2;
        pcVar8 = "\\0";
        break;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
switchD_00169d64_caseD_1:
        uVar2 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
        lVar6 = *(long *)os;
        *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 8) = 2;
        *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) | 0x4000;
        std::ostream::operator<<((ostream *)os,(uint)bVar1);
        *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar2;
        goto LAB_00169ecb;
      case 7:
        lVar6 = 2;
        pcVar8 = "\\a";
        break;
      case 8:
        lVar6 = 2;
        pcVar8 = "\\b";
        break;
      case 9:
        lVar6 = 2;
        pcVar8 = "\\t";
        break;
      case 10:
        lVar6 = 2;
        pcVar8 = "\\n";
        break;
      case 0xb:
        lVar6 = 2;
        pcVar8 = "\\v";
        break;
      case 0xc:
        lVar6 = 2;
        pcVar8 = "\\f";
        break;
      case 0xd:
        lVar6 = 2;
        pcVar8 = "\\r";
        break;
      default:
        if (bVar1 != 0x20) goto switchD_00169d64_caseD_1;
        local_3c[1] = 0x20;
        lVar6 = 1;
        pcVar8 = (char *)(local_3c + 1);
      }
LAB_00169ec6:
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,lVar6);
LAB_00169ecb:
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  local_3c[3] = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(local_3c + 3),1);
  return;
}

Assistant:

void showValue(const std::string &value, std::ostream &os) {
  const auto &locale = std::locale::classic();
  os << '"';
  for (char c : value) {
    if (!std::isspace(c, locale) && std::isprint(c, locale)) {
      switch (c) {
      case '\\':
        os << "\\";
        break;
      case '"':
        os << "\\\"";
        break;
      default:
        os << c;
      }
    } else {
      switch (c) {
      case 0x00:
        os << "\\0";
        break;
      case 0x07:
        os << "\\a";
        break;
      case 0x08:
        os << "\\b";
        break;
      case 0x0C:
        os << "\\f";
        break;
      case 0x0A:
        os << "\\n";
        break;
      case 0x0D:
        os << "\\r";
        break;
      case 0x09:
        os << "\\t";
        break;
      case 0x0B:
        os << "\\v";
        break;
      case ' ':
        os << ' ';
        break;
      default:
        auto flags = os.flags();
        os << "\\x";
        os << std::hex << std::setprecision(2) << std::uppercase
           << static_cast<int>(c & 0xFF);
        os.flags(flags);
      }
    }
  }
  os << '"';
}